

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O0

int __thiscall DIntermissionScreenCast::Ticker(DIntermissionScreenCast *this)

{
  bool bVar1;
  int iVar2;
  FState *pFVar3;
  DIntermissionScreenCast *this_local;
  
  DIntermissionScreen::Ticker(&this->super_DIntermissionScreen);
  iVar2 = this->casttics + -1;
  this->casttics = iVar2;
  if ((0 < iVar2) && (this->caststate != (FState *)0x0)) {
    return 0;
  }
  if ((((this->caststate == (FState *)0x0) ||
       (iVar2 = FState::GetTics(this->caststate), iVar2 == -1)) ||
      (pFVar3 = FState::GetNextState(this->caststate), pFVar3 == (FState *)0x0)) ||
     ((pFVar3 = FState::GetNextState(this->caststate), pFVar3 == this->caststate &&
      ((this->castdeath & 1U) != 0)))) {
    return -1;
  }
  if (this->caststate != this->advplayerstate) {
    pFVar3 = FState::GetNextState(this->caststate);
    this->caststate = pFVar3;
    PlayAttackSound(this);
    this->castframes = this->castframes + 1;
    if ((this->castframes == 0xc) && ((this->castdeath & 1U) == 0)) {
      this->castattacking = true;
      bVar1 = PClass::IsDescendantOf
                        (&this->mClass->super_PClass,APlayerPawn::RegistrationInfo.MyClass);
      if (bVar1) {
        pFVar3 = this->mDefaults->MissileState;
        this->caststate = pFVar3;
        this->basestate = pFVar3;
      }
      else {
        if (this->castonmelee == 0) {
          pFVar3 = this->mDefaults->MissileState;
          this->caststate = pFVar3;
          this->basestate = pFVar3;
        }
        else {
          pFVar3 = this->mDefaults->MeleeState;
          this->caststate = pFVar3;
          this->basestate = pFVar3;
        }
        this->castonmelee = this->castonmelee ^ 1;
        if (this->caststate == (FState *)0x0) {
          if (this->castonmelee == 0) {
            pFVar3 = this->mDefaults->MissileState;
            this->caststate = pFVar3;
            this->basestate = pFVar3;
          }
          else {
            pFVar3 = this->mDefaults->MeleeState;
            this->caststate = pFVar3;
            this->basestate = pFVar3;
          }
        }
      }
      PlayAttackSound(this);
    }
    if (((this->castattacking & 1U) == 0) ||
       ((this->castframes != 0x18 && (this->caststate != this->mDefaults->SeeState))))
    goto LAB_003b3f4e;
  }
  this->castattacking = false;
  this->castframes = 0;
  this->caststate = this->mDefaults->SeeState;
LAB_003b3f4e:
  iVar2 = FState::GetTics(this->caststate);
  this->casttics = iVar2;
  if (this->casttics == -1) {
    this->casttics = 0xf;
  }
  return 0;
}

Assistant:

int DIntermissionScreenCast::Ticker ()
{
	Super::Ticker();

	if (--casttics > 0 && caststate != NULL)
		return 0; 				// not time to change state yet

	if (caststate == NULL || caststate->GetTics() == -1 || caststate->GetNextState() == NULL ||
		(caststate->GetNextState() == caststate && castdeath))
	{
		return -1;
	}
	else
	{
		// just advance to next state in animation
		if (caststate == advplayerstate)
			goto stopattack;	// Oh, gross hack!

		caststate = caststate->GetNextState();

		PlayAttackSound();
		castframes++;
	}

	if (castframes == 12 && !castdeath)
	{
		// go into attack frame
		castattacking = true;
		if (!mClass->IsDescendantOf(RUNTIME_CLASS(APlayerPawn)))
		{
			if (castonmelee)
				basestate = caststate = mDefaults->MeleeState;
			else
				basestate = caststate = mDefaults->MissileState;
			castonmelee ^= 1;
			if (caststate == NULL)
			{
				if (castonmelee)
					basestate = caststate = mDefaults->MeleeState;
				else
					basestate = caststate = mDefaults->MissileState;
			}
		}
		else
		{
			// The players use the melee state differently so it can't be used here
			basestate = caststate = mDefaults->MissileState;
		}
		PlayAttackSound();
	}

	if (castattacking)
	{
		if (castframes == 24 || caststate == mDefaults->SeeState )
		{
		  stopattack:
			castattacking = false;
			castframes = 0;
			caststate = mDefaults->SeeState;
		}
	}

	casttics = caststate->GetTics();
	if (casttics == -1)
		casttics = 15;
	return 0;
}